

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O2

void __thiscall lsim::ModelWire::move(ModelWire *this,Point *delta)

{
  pointer puVar1;
  unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_> *junction;
  pointer puVar2;
  
  puVar1 = (this->m_junctions).
           super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->m_junctions).
                super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    ModelWireJunction::move
              ((puVar2->_M_t).
               super___uniq_ptr_impl<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>
               ._M_t.
               super__Tuple_impl<0UL,_lsim::ModelWireJunction_*,_std::default_delete<lsim::ModelWireJunction>_>
               .super__Head_base<0UL,_lsim::ModelWireJunction_*,_false>._M_head_impl,delta);
  }
  return;
}

Assistant:

void ModelWire::move(const Point& delta) {
	for (auto& junction : m_junctions) {
		junction->move(delta);
	}
}